

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O2

_Bool bool_exec(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_fiber_t *fiber;
  undefined6 in_register_00000012;
  gravity_value_t gVar1;
  char _buffer [4096];
  char local_1018 [4096];
  
  if ((int)CONCAT62(in_register_00000012,nargs) == 2) {
    gVar1 = convert_value2bool(vm,args[1]);
    if (gVar1.isa != (gravity_class_t *)0x0) {
      gravity_vm_setslot(vm,gVar1,rindex);
      return true;
    }
    builtin_strncpy(local_1018,"Unable to convert object to Bool.",0x22);
  }
  else {
    builtin_strncpy(local_1018 + 0x10,"t is expected in Bool casting.",0x1f);
    builtin_strncpy(local_1018,"A single argumen",0x10);
  }
  fiber = gravity_vm_fiber(vm);
  gravity_fiber_seterror(fiber,local_1018);
  gVar1.field_1.n = 0;
  gVar1.isa = gravity_class_null;
  gravity_vm_setslot(vm,gVar1,rindex);
  return false;
}

Assistant:

static bool bool_exec (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    if (nargs != 2) RETURN_ERROR("A single argument is expected in Bool casting.");

    gravity_value_t v = convert_value2bool(vm, GET_VALUE(1));
    if (VALUE_ISA_NOTVALID(v)) RETURN_ERROR("Unable to convert object to Bool.");
    RETURN_VALUE(v, rindex);
}